

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::loop(Connection *this)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  Connection *this_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_03;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_04;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other_01;
  ForkedPromise<void> *this_05;
  long lVar1;
  long *plVar2;
  SourceLocation location;
  LoopResult LVar3;
  bool bVar4;
  LoopResult value;
  coroutine_handle<void> handle;
  HttpInputStreamImpl *this_06;
  undefined8 in_RSI;
  byte bVar5;
  Coroutine<kj::HttpServer::Connection::LoopResult> *pCVar6;
  
  handle._M_fr_ptr = operator_new(0x6e8);
  *(code **)handle._M_fr_ptr = loop;
  *(code **)((long)handle._M_fr_ptr + 8) = loop;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x6d8) = in_RSI;
  location.function = "loop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1d3c;
  location.columnNumber = 0x1b;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)((long)handle._M_fr_ptr + 0x238);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x430);
  this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x670);
  this_02 = (Connection *)((long)handle._M_fr_ptr + 0x678);
  other = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x680);
  this_03 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x688);
  this_04 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x698);
  this_06 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x6d0);
  other_00 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x6b0);
  other_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x6b8);
  this_05 = (ForkedPromise<void> *)((long)handle._M_fr_ptr + 0x6c0);
  bVar5 = 1;
  pCVar6 = this_00;
  do {
    *(int *)((long)handle._M_fr_ptr + 0x6e0) = (int)pCVar6;
    *(byte *)((long)handle._M_fr_ptr + 0x6e5) = bVar5;
    if ((((bVar5 & 1) == 0) &&
        (*(char *)(*(long *)(*(long *)((long)handle._M_fr_ptr + 0x6d8) + 0x18) + 0x70) == '\x01'))
       && (bVar4 = anon_unknown_36::HttpInputStreamImpl::isCleanDrain
                             ((HttpInputStreamImpl *)
                              (*(long *)((long)handle._M_fr_ptr + 0x6d8) + 0x38)), bVar4)) {
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                      *)this_00,BREAK_LOOP_CONN_OK);
      goto LAB_003468d5;
    }
    anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(this_06);
    if ((bVar5 & 1) == 0) {
      lVar1 = *(long *)(*(long *)((long)handle._M_fr_ptr + 0x6d8) + 0x18);
      plVar2 = *(long **)(lVar1 + 8);
      (**(code **)(*plVar2 + 0x10))(this_01,plVar2,*(undefined8 *)(lVar1 + 0x38));
      bVar4 = anon_unknown_36::HttpInputStreamImpl::isCleanDrain
                        ((HttpInputStreamImpl *)(*(long *)((long)handle._M_fr_ptr + 0x6d8) + 0x38));
      if (bVar4) {
        ForkedPromise<void>::addBranch(this_05);
        *(undefined8 *)((long)handle._M_fr_ptr + 0x238) =
             *(undefined8 *)((long)handle._M_fr_ptr + 0x6d8);
        Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_1_>
                  ((Promise<void> *)((long)handle._M_fr_ptr + 0x6c8),
                   (anon_class_8_1_8991fb9c_for_func *)this_05);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_05);
        *(char **)((long)handle._M_fr_ptr + 0x640) =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
        ;
        *(char **)((long)handle._M_fr_ptr + 0x648) = "loop";
        *(undefined8 *)((long)handle._M_fr_ptr + 0x650) = 0x1c00001d69;
        Promise<void>::exclusiveJoin
                  ((Promise<void> *)other_01,(Promise<void> *)this_01,
                   *(SourceLocation *)((long)handle._M_fr_ptr + 0x640));
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=(this_01,other_01);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(other_01);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                   ((long)handle._M_fr_ptr + 0x6c8));
      }
      *(undefined8 *)((long)handle._M_fr_ptr + 0x6a0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x6d8);
      Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_2_>
                ((Promise<void> *)((long)handle._M_fr_ptr + 0x6a8),
                 (anon_class_8_1_8991fb9c_for_func *)this_01);
      *(char **)((long)handle._M_fr_ptr + 0x658) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)handle._M_fr_ptr + 0x660) = "loop";
      *(undefined8 *)((long)handle._M_fr_ptr + 0x668) = 0x1500001d6c;
      Promise<bool>::exclusiveJoin
                ((Promise<bool> *)other_00,(Promise<bool> *)this_06,
                 *(SourceLocation *)((long)handle._M_fr_ptr + 0x658));
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_06,other_00);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(other_00);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x6a8)
                );
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
    }
    *(undefined8 *)((long)handle._M_fr_ptr + 0x238) =
         *(undefined8 *)((long)handle._M_fr_ptr + 0x6d8);
    *(byte *)((long)handle._M_fr_ptr + 0x240) = bVar5 & 1;
    Promise<bool>::then<kj::HttpServer::Connection::loop()::_lambda(bool)_1_>
              ((Promise<bool> *)this_04,(anon_class_16_2_14bf747a_for_func *)this_06);
    if ((bVar5 & 1) != 0) {
      lVar1 = *(long *)(*(long *)((long)handle._M_fr_ptr + 0x6d8) + 0x18);
      plVar2 = *(long **)(lVar1 + 8);
      (**(code **)(*plVar2 + 0x10))(this_03,plVar2,*(undefined8 *)(lVar1 + 0x30));
      *(undefined8 *)((long)handle._M_fr_ptr + 0x238) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x6d8);
      Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_3_>
                ((Promise<void> *)((long)handle._M_fr_ptr + 0x690),
                 (anon_class_8_1_8991fb9c_for_func *)this_03);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_03);
      *(char **)((long)handle._M_fr_ptr + 0x628) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)handle._M_fr_ptr + 0x630) = "loop";
      *(undefined8 *)((long)handle._M_fr_ptr + 0x638) = 0x1b00001d9e;
      Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::exclusiveJoin((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                       *)other,(Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                                *)this_04,*(SourceLocation *)((long)handle._M_fr_ptr + 0x628));
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=(this_04,other);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(other);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x690)
                );
    }
    co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr__,
               (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)this_04);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x6e4) = 0;
    bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar4) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                    *)((long)handle._M_fr_ptr + 0x5e8),__return_storage_ptr__);
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~PromiseAwaiter(__return_storage_ptr__);
    onHeaders(this_02,*(RequestConnectOrProtocolError **)((long)handle._M_fr_ptr + 0x6d8));
    co_await<kj::HttpServer::Connection::LoopResult>
              (__return_storage_ptr___00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_02)
    ;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x6e4) = 1;
    bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (bVar4) {
      return (PromiseBase)(PromiseBase)this;
    }
    value = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                      (__return_storage_ptr___00);
    pCVar6 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)(ulong)value;
    kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
              (__return_storage_ptr___00);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
    if (value - BREAK_LOOP_CONN_OK < 2) {
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                      *)this_00,value);
      LVar3 = BREAK_LOOP_CONN_ERR|BREAK_LOOP_CONN_OK;
LAB_0034687a:
      value = LVar3;
      bVar5 = *(byte *)((long)handle._M_fr_ptr + 0x6e5);
    }
    else {
      bVar5 = 0;
      LVar3 = CONTINUE_LOOP;
      if (value != CONTINUE_LOOP) goto LAB_0034687a;
    }
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_04);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_06);
  } while (value == CONTINUE_LOOP);
  if (value == (BREAK_LOOP_CONN_ERR|BREAK_LOOP_CONN_OK)) {
LAB_003468d5:
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x6e4) = 2;
  }
  else {
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::~Coroutine(this_00);
    operator_delete(handle._M_fr_ptr,0x6e8);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> loop() {
    bool firstRequest = true;

    while (true) {
      if (!firstRequest && server.draining && httpInput.isCleanDrain()) {
        // Don't call awaitNextMessage() in this case because that will initiate a read() which will
        // immediately be canceled, losing data.
        co_return BREAK_LOOP_CONN_OK;
      }

      auto firstByte = httpInput.awaitNextMessage();

      if (!firstRequest) {
        // For requests after the first, require that the first byte arrive before the pipeline
        // timeout, otherwise treat it like the connection was simply closed.
        auto timeoutPromise = server.timer.afterDelay(server.settings.pipelineTimeout);

        if (httpInput.isCleanDrain()) {
          // If we haven't buffered any data, then we can safely drain here, so allow the wait to
          // be canceled by the onDrain promise.
          auto cleanDrainPromise = server.onDrain.addBranch()
              .then([this]() -> kj::Promise<void> {
            // This is a little tricky... drain() has been called, BUT we could have read some data
            // into the buffer in the meantime, and we don't want to lose that. If any data has
            // arrived, then we have no choice but to read the rest of the request and respond to
            // it.
            if (!httpInput.isCleanDrain()) {
              return kj::NEVER_DONE;
            }

            // OK... As far as we know, no data has arrived in the buffer. However, unfortunately,
            // we don't *really* know that, because read() is asynchronous. It may have already
            // delivered some bytes, but we just haven't received the notification yet, because it's
            // still queued on the event loop. As a horrible hack, we use evalLast(), so that any
            // such pending notifications get a chance to be delivered.
            // TODO(someday): Does this actually work on Windows, where the notification could also
            //   be queued on the IOCP?
            return kj::evalLast([this]() -> kj::Promise<void> {
              if (httpInput.isCleanDrain()) {
                return kj::READY_NOW;
              } else {
                return kj::NEVER_DONE;
              }
            });
          });
          timeoutPromise = timeoutPromise.exclusiveJoin(kj::mv(cleanDrainPromise));
        }

        firstByte = firstByte.exclusiveJoin(timeoutPromise.then([this]() -> bool {
          timedOut = true;
          return false;
        }));
      }

      auto receivedHeaders = firstByte
          .then([this,firstRequest](bool hasData)
              -> kj::Promise<HttpHeaders::RequestConnectOrProtocolError> {
        if (hasData) {
          auto readHeaders = httpInput.readRequestHeaders();
          if (!firstRequest) {
            // On requests other than the first, the header timeout starts ticking when we receive
            // the first byte of a pipeline response.
            readHeaders = readHeaders.exclusiveJoin(
                server.timer.afterDelay(server.settings.headerTimeout)
                .then([this]() -> HttpHeaders::RequestConnectOrProtocolError {
              timedOut = true;
              return HttpHeaders::ProtocolError {
                408, "Request Timeout",
                "Timed out waiting for next request headers.", nullptr
              };
            }));
          }
          return kj::mv(readHeaders);
        } else {
          // Client closed connection or pipeline timed out with no bytes received. This is not an
          // error, so don't report one.
          this->closed = true;
          return HttpHeaders::RequestConnectOrProtocolError(HttpHeaders::ProtocolError {
            408, "Request Timeout",
            "Client closed connection or connection timeout "
            "while waiting for request headers.", nullptr
          });
        }
      });

      if (firstRequest) {
        // On the first request, the header timeout starts ticking immediately upon request opening.
        // NOTE: Since we assume that the client wouldn't have formed a connection if they did not
        //   intend to send a request, we immediately treat this connection as having an active
        //   request, i.e. we do NOT cancel it if drain() is called.
        auto timeoutPromise = server.timer.afterDelay(server.settings.headerTimeout)
            .then([this]() -> HttpHeaders::RequestConnectOrProtocolError {
          timedOut = true;
          return HttpHeaders::ProtocolError {
            408, "Request Timeout",
            "Timed out waiting for initial request headers.", nullptr
          };
        });
        receivedHeaders = receivedHeaders.exclusiveJoin(kj::mv(timeoutPromise));
      }

      auto requestOrProtocolError = co_await receivedHeaders;
      auto loopResult = co_await onHeaders(kj::mv(requestOrProtocolError));

      switch (loopResult) {
        case BREAK_LOOP_CONN_ERR:
        case BREAK_LOOP_CONN_OK: co_return loopResult;
        case CONTINUE_LOOP: {
          firstRequest = false;
        }
      }
    }
  }